

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

void __thiscall
soul::heart::Parser::parseVariableAssignment
          (Parser *this,FunctionParseState *state,FunctionBuilder *builder,AssignmentTarget *target)

{
  SourceCodeText *o;
  Expression *pEVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Expression *source;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pool_ptr<soul::heart::Expression> v;
  CodeLocation errorLocation;
  undefined1 local_80 [16];
  char *local_70;
  CompileMessage local_68;
  
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x27e59e);
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"call");
  if (bVar2) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    parseFunctionCall(this,state,builder,target);
    return;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"read");
  if (bVar2) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    parseReadStream(this,state,builder,target);
    return;
  }
  o = (this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      ).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  local_70 = (this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).location.location.data;
  local_80._8_8_ = o;
  source = parseExpression(this,state);
  iVar3 = (*(source->super_Object)._vptr_Object[2])(source);
  pEVar1 = (target->existingVariable).object;
  if (pEVar1 != (Expression *)0x0) {
    iVar4 = (*(pEVar1->super_Object)._vptr_Object[2])();
    bVar2 = TypeRules::canPassAsArgumentTo
                      ((Type *)CONCAT44(extraout_var_00,iVar4),(Type *)CONCAT44(extraout_var,iVar3),
                       true);
    if (!bVar2) {
      CompileMessageHelpers::createMessage<>(&local_68,syntax,error,"Incompatible target type");
      CodeLocation::throwError((CodeLocation *)(local_80 + 8),&local_68);
    }
  }
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x27ca5c);
  (*(source->super_Object)._vptr_Object[2])(source);
  AssignmentTarget::create
            ((AssignmentTarget *)local_80,(FunctionParseState *)target,(FunctionBuilder *)state,
             (Type *)builder);
  if ((Expression *)local_80._0_8_ != (Expression *)0x0) {
    BlockBuilder::addAssignment(&builder->super_BlockBuilder,(Expression *)local_80._0_8_,source);
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  return;
}

Assistant:

void parseVariableAssignment (FunctionParseState& state, FunctionBuilder& builder, const AssignmentTarget& target)
    {
        expect (HEARTOperator::assign);

        if (matchIf ("call"))
            return parseFunctionCall (state, builder, target);

        if (matchIf ("read"))
            return parseReadStream (state, builder, target);

        auto errorLocation = location;
        auto& sourceValue = parseExpression (state);

        if (! target.checkType (sourceValue.getType()))
            errorLocation.throwError (Errors::incompatibleTargetType());

        expectSemicolon();

        if (auto v = target.create (state, builder, sourceValue.getType()))
            builder.addAssignment (*v, sourceValue);
    }